

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Number __thiscall LiteScript::Number::operator*(Number *this,Number *number)

{
  int iVar1;
  char *in_RDX;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)(number->value).integer;
  if (number->numeric_type == '\0' && *in_RDX == '\0') {
    iVar1 = *(int *)(in_RDX + 4);
    this->numeric_type = '\0';
    (this->value).integer = (int)fVar2 * iVar1;
  }
  else {
    if (number->numeric_type == '\0') {
      fVar2 = (float)(int)fVar2;
    }
    fVar3 = *(float *)(in_RDX + 4);
    if (*in_RDX == '\0') {
      fVar3 = (float)(int)fVar3;
    }
    fVar2 = fVar2 * fVar3;
    fVar3 = roundf(fVar2);
    if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
      this->numeric_type = '\x01';
      (this->value).flotting = fVar2;
    }
    else {
      this->numeric_type = '\0';
      (this->value).integer = (int)fVar2;
    }
  }
  return (Number)this;
}

Assistant:

LiteScript::Number LiteScript::Number::operator*(const LiteScript::Number& number) const {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        return Number(this->value.integer * number.value.integer);
    else
        return Number((float)*this * (float)number);
}